

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O0

uint32_t __thiscall cppnet::BufferQueue::Read(BufferQueue *this,char *res,uint32_t len)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  element_type *peVar4;
  undefined1 local_90 [32];
  undefined1 local_70 [16];
  ListSlot<cppnet::BufferBlock> local_60;
  undefined1 local_38 [4];
  uint32_t total_read_len;
  shared_ptr<cppnet::BufferBlock> buffer_read;
  uint32_t len_local;
  char *res_local;
  BufferQueue *this_local;
  
  buffer_read.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = len;
  uVar2 = List<cppnet::BufferBlock>::Size(&this->_buffer_list);
  if (((uVar2 == 0) || (res == (char *)0x0)) ||
     (buffer_read.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ == 0)) {
    this_local._4_4_ = 0;
  }
  else {
    List<cppnet::BufferBlock>::GetHead((List<cppnet::BufferBlock> *)local_38);
    local_60._next.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._4_4_ = 0;
    do {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
      if (!bVar1) break;
      peVar4 = std::
               __shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
      iVar3 = (*(peVar4->super_InnerBuffer).super_Buffer._vptr_Buffer[3])
                        (peVar4,res + local_60._next.
                                      super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi._4_4_,
                         (ulong)(buffer_read.
                                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi._4_4_ -
                                local_60._next.
                                super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi._4_4_));
      local_60._next.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi._4_4_ = iVar3 + local_60._next.
                             super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._4_4_;
      if (buffer_read.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_ <=
          local_60._next.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_) break;
      bVar1 = std::operator==((shared_ptr<cppnet::BufferBlock> *)local_38,&this->_buffer_write);
      if (bVar1) {
        std::__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&this->_buffer_write);
        ListSlot<cppnet::BufferBlock>::GetNext((ListSlot<cppnet::BufferBlock> *)(local_70 + 0x10));
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(local_70 + 0x10));
        std::shared_ptr<cppnet::BufferBlock>::~shared_ptr
                  ((shared_ptr<cppnet::BufferBlock> *)(local_70 + 0x10));
        if (!bVar1) {
          (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[0x12])();
          break;
        }
        std::__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&this->_buffer_write);
        ListSlot<cppnet::BufferBlock>::GetNext((ListSlot<cppnet::BufferBlock> *)local_70);
        std::shared_ptr<cppnet::BufferBlock>::operator=
                  (&this->_buffer_write,(shared_ptr<cppnet::BufferBlock> *)local_70);
        std::shared_ptr<cppnet::BufferBlock>::~shared_ptr
                  ((shared_ptr<cppnet::BufferBlock> *)local_70);
      }
      List<cppnet::BufferBlock>::PopFront((List<cppnet::BufferBlock> *)(local_90 + 0x10));
      std::shared_ptr<cppnet::BufferBlock>::~shared_ptr
                ((shared_ptr<cppnet::BufferBlock> *)(local_90 + 0x10));
      List<cppnet::BufferBlock>::GetHead((List<cppnet::BufferBlock> *)local_90);
      std::shared_ptr<cppnet::BufferBlock>::operator=
                ((shared_ptr<cppnet::BufferBlock> *)local_38,
                 (shared_ptr<cppnet::BufferBlock> *)local_90);
      std::shared_ptr<cppnet::BufferBlock>::~shared_ptr((shared_ptr<cppnet::BufferBlock> *)local_90)
      ;
      peVar4 = std::
               __shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
      iVar3 = (*(peVar4->super_InnerBuffer).super_Buffer._vptr_Buffer[8])();
    } while (iVar3 != 0);
    this->_can_read_length =
         this->_can_read_length -
         local_60._next.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._4_4_;
    this_local._4_4_ =
         local_60._next.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._4_4_;
    std::shared_ptr<cppnet::BufferBlock>::~shared_ptr((shared_ptr<cppnet::BufferBlock> *)local_38);
  }
  return this_local._4_4_;
}

Assistant:

uint32_t BufferQueue::Read(char* res, uint32_t len) {
    if (_buffer_list.Size() == 0 || !res || len == 0) {
        return 0;
    }

    auto buffer_read = _buffer_list.GetHead();
    uint32_t total_read_len = 0;
    while (buffer_read) {
        total_read_len += buffer_read->Read(res + total_read_len, len - total_read_len);
        if (total_read_len >= len) {
            break;
        }
        if (buffer_read == _buffer_write) {
            if (_buffer_write->GetNext()) {
                _buffer_write = _buffer_write->GetNext();

            } else {
                Reset();
                break;
            }
        }
        _buffer_list.PopFront();
        buffer_read = _buffer_list.GetHead();
        if (buffer_read->GetCanReadLength() == 0) {
            break;
        }
    }
    _can_read_length -= total_read_len;
    return total_read_len;
}